

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O1

TrigramGenerator get_generator_for(IndexType type)

{
  runtime_error *this;
  
  if (type - GRAM3 < 4) {
    return (TrigramGenerator)(&PTR_gen_trigrams_00223a10)[type - GRAM3];
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"unhandled index type");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

TrigramGenerator get_generator_for(IndexType type) {
    switch (type) {
        case IndexType::GRAM3:
            return gen_trigrams;
        case IndexType::TEXT4:
            return gen_b64grams;
        case IndexType::HASH4:
            return gen_h4grams;
        case IndexType::WIDE8:
            return gen_wide_b64grams;
    }

    throw std::runtime_error("unhandled index type");
}